

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTAudioEngine_ShutDown(FACTAudioEngine *pEngine)

{
  uint32_t uVar1;
  FAudioMutex mutex;
  FAudioReallocFunc p_Var2;
  FAudioMallocFunc p_Var3;
  FAudioFreeFunc p_Var4;
  ulong uVar5;
  long lVar6;
  
  pEngine->initialized = '\0';
  FAudio_PlatformWaitThread(pEngine->apiThread,(int32_t *)0x0);
  FAudio_PlatformLockMutex(pEngine->apiLock);
  if (pEngine->audio != (FAudio *)0x0) {
    FAudio_StopEngine(pEngine->audio);
  }
  while (pEngine->wbList != (LinkedList *)0x0) {
    FACTWaveBank_Destroy((FACTWaveBank *)pEngine->wbList->entry);
  }
  while (pEngine->sbList != (LinkedList *)0x0) {
    FACTSoundBank_Destroy((FACTSoundBank *)pEngine->sbList->entry);
  }
  if (pEngine->categoryCount != 0) {
    uVar5 = 0;
    do {
      (*pEngine->pFree)(pEngine->categoryNames[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < pEngine->categoryCount);
  }
  (*pEngine->pFree)(pEngine->categoryNames);
  (*pEngine->pFree)(pEngine->categories);
  if (pEngine->variableCount != 0) {
    uVar5 = 0;
    do {
      (*pEngine->pFree)(pEngine->variableNames[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar5 < pEngine->variableCount);
  }
  (*pEngine->pFree)(pEngine->variableNames);
  (*pEngine->pFree)(pEngine->variables);
  (*pEngine->pFree)(pEngine->globalVariableValues);
  if (pEngine->rpcCount != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      (*pEngine->pFree)(*(void **)((long)&pEngine->rpcs->variable + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < pEngine->rpcCount);
  }
  (*pEngine->pFree)(pEngine->rpcs);
  (*pEngine->pFree)(pEngine->rpcCodes);
  if (pEngine->dspPresetCount != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      (*pEngine->pFree)(*(void **)(&pEngine->dspPresets->accessibility + lVar6));
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar5 < pEngine->dspPresetCount);
  }
  (*pEngine->pFree)(pEngine->dspPresets);
  (*pEngine->pFree)(pEngine->dspPresetCodes);
  if (pEngine->reverbVoice != (FAudioVoice *)0x0) {
    FAudioVoice_DestroyVoice(pEngine->reverbVoice);
  }
  if (pEngine->master != (FAudioVoice *)0x0) {
    FAudioVoice_DestroyVoice(pEngine->master);
  }
  if (pEngine->audio != (FAudio *)0x0) {
    FAudio_Release(pEngine->audio);
  }
  uVar1 = pEngine->refcount;
  mutex = pEngine->apiLock;
  p_Var2 = pEngine->pRealloc;
  p_Var3 = pEngine->pMalloc;
  p_Var4 = pEngine->pFree;
  SDL_memset(pEngine,0,0x110);
  pEngine->pMalloc = p_Var3;
  pEngine->pFree = p_Var4;
  pEngine->pRealloc = p_Var2;
  pEngine->refcount = uVar1;
  pEngine->apiLock = mutex;
  FAudio_PlatformUnlockMutex(mutex);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_ShutDown(FACTAudioEngine *pEngine)
{
	uint32_t i, refcount;
	FAudioMutex mutex;
	FAudioMallocFunc pMalloc;
	FAudioFreeFunc pFree;
	FAudioReallocFunc pRealloc;

	/* Close thread, then lock ASAP */
	pEngine->initialized = 0;
	FAudio_PlatformWaitThread(pEngine->apiThread, NULL);
	FAudio_PlatformLockMutex(pEngine->apiLock);

	/* Stop the platform stream before freeing stuff! */
	if (pEngine->audio != NULL)
	{
		FAudio_StopEngine(pEngine->audio);
	}

	/* This method destroys all existing cues, sound banks, and wave banks.
	 * It blocks until all cues are destroyed.
	 */
	while (pEngine->wbList != NULL)
	{
		FACTWaveBank_Destroy((FACTWaveBank*) pEngine->wbList->entry);
	}
	while (pEngine->sbList != NULL)
	{
		FACTSoundBank_Destroy((FACTSoundBank*) pEngine->sbList->entry);
	}

	/* Category data */
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		pEngine->pFree(pEngine->categoryNames[i]);
	}
	pEngine->pFree(pEngine->categoryNames);
	pEngine->pFree(pEngine->categories);

	/* Variable data */
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->pFree(pEngine->variableNames[i]);
	}
	pEngine->pFree(pEngine->variableNames);
	pEngine->pFree(pEngine->variables);
	pEngine->pFree(pEngine->globalVariableValues);

	/* RPC data */
	for (i = 0; i < pEngine->rpcCount; i += 1)
	{
		pEngine->pFree(pEngine->rpcs[i].points);
	}
	pEngine->pFree(pEngine->rpcs);
	pEngine->pFree(pEngine->rpcCodes);

	/* DSP data */
	for (i = 0; i < pEngine->dspPresetCount; i += 1)
	{
		pEngine->pFree(pEngine->dspPresets[i].parameters);
	}
	pEngine->pFree(pEngine->dspPresets);
	pEngine->pFree(pEngine->dspPresetCodes);

	/* Audio resources */
	if (pEngine->reverbVoice != NULL)
	{
		FAudioVoice_DestroyVoice(pEngine->reverbVoice);
	}
	if (pEngine->master != NULL)
	{
		FAudioVoice_DestroyVoice(pEngine->master);
	}
	if (pEngine->audio != NULL)
	{
		FAudio_Release(pEngine->audio);
	}

	/* Finally. */
	refcount = pEngine->refcount;
	mutex = pEngine->apiLock;
	pMalloc = pEngine->pMalloc;
	pFree = pEngine->pFree;
	pRealloc = pEngine->pRealloc;
	FAudio_zero(pEngine, sizeof(FACTAudioEngine));
	pEngine->pMalloc = pMalloc;
	pEngine->pFree = pFree;
	pEngine->pRealloc = pRealloc;
	pEngine->refcount = refcount;
	pEngine->apiLock = mutex;

	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}